

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O1

void __thiscall
webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>::Frame
          (Frame<webfront::networking::TCPNetworkingTS> *this,string_view text)

{
  byte bVar1;
  Header *pHVar2;
  ulong uVar3;
  byte bVar4;
  Frame<webfront::networking::TCPNetworkingTS> *local_30;
  unsigned_long local_28;
  
  (this->super_Header).raw._M_elems[0] = 0;
  (this->super_Header).raw._M_elems[1] = 0;
  (this->super_Header).raw._M_elems[2] = 0;
  (this->super_Header).raw._M_elems[3] = 0;
  (this->super_Header).raw._M_elems[4] = 0;
  (this->super_Header).raw._M_elems[5] = 0;
  (this->super_Header).raw._M_elems[6] = 0;
  (this->super_Header).raw._M_elems[7] = 0;
  pHVar2 = &this->super_Header;
  (pHVar2->raw)._M_elems[6] = 0;
  (pHVar2->raw)._M_elems[7] = 0;
  (pHVar2->raw)._M_elems[8] = 0;
  (pHVar2->raw)._M_elems[9] = 0;
  (pHVar2->raw)._M_elems[10] = 0;
  (pHVar2->raw)._M_elems[0xb] = 0;
  (pHVar2->raw)._M_elems[0xc] = 0;
  (pHVar2->raw)._M_elems[0xd] = 0;
  (this->buffers).
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers).
  super__Vector_base<std::experimental::net::v1::const_buffer,_std::allocator<std::experimental::net::v1::const_buffer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Header).raw._M_elems[0] = 0x81;
  Header::setPayloadSize(&this->super_Header,text._M_len);
  bVar1 = (this->super_Header).raw._M_elems[1];
  bVar4 = bVar1 & 0x7f;
  uVar3 = (ulong)(bVar1 >> 7);
  if (bVar4 < 0x7e) {
    local_28 = uVar3 * 4 + 2;
  }
  else if (bVar4 == 0x7e) {
    local_28 = uVar3 * 4 + 4;
  }
  else {
    local_28 = uVar3 * 4 + 10;
  }
  local_30 = this;
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
              *)&this->buffers,(byte **)&local_30,&local_28);
  local_30 = (Frame<webfront::networking::TCPNetworkingTS> *)text._M_str;
  local_28 = text._M_len;
  std::
  vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
  ::emplace_back<std::byte_const*,unsigned_long>
            ((vector<std::experimental::net::v1::const_buffer,std::allocator<std::experimental::net::v1::const_buffer>>
              *)&this->buffers,(byte **)&local_30,&local_28);
  return;
}

Assistant:

Frame(std::string_view text) {
        setFIN(true);
        setOpcode(Opcode::text);
        setPayloadSize(text.size());
        buffers.emplace_back(raw.data(), headerSize());
        buffers.emplace_back(reinterpret_cast<const std::byte*>(text.data()), text.size());
    }